

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osportable.cc
# Opt level: O3

void safe_strcpy(char *dst,size_t dstlen,char *src)

{
  size_t sVar1;
  ulong __n;
  char *__s;
  
  if (dst != src && (dstlen != 0 && dst != (char *)0x0)) {
    __s = "";
    if (src != (char *)0x0) {
      __s = src;
    }
    sVar1 = strlen(__s);
    __n = dstlen - 1;
    if (sVar1 < dstlen - 1) {
      __n = sVar1;
    }
    memcpy(dst,__s,__n);
    dst[__n] = '\0';
  }
  return;
}

Assistant:

static void
safe_strcpy(char *dst, size_t dstlen, const char *src)
{
    size_t copylen;

    /* do nothing if there's no output buffer */
    if (dst == 0 || dstlen == 0)
        return;

    /* do nothing if the source and destination buffers are the same */
    if (dst == src)
        return;

    /* use an empty string if given a null string */
    if (src == 0)
        src = "";

    /* 
     *   figure the copy length - use the smaller of the actual string size
     *   or the available buffer size, minus one for the null terminator 
     */
    copylen = strlen(src);
    if (copylen > dstlen - 1)
        copylen = dstlen - 1;

    /* copy the string (or as much as we can) */
    memcpy(dst, src, copylen);

    /* null-terminate it */
    dst[copylen] = '\0';
}